

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

void __thiscall QUEUE::print(QUEUE *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  int input_len;
  int output_len;
  QUEUE *this_local;
  
  iVar1 = STACK::operator_cast_to_int(&this->s2);
  iVar2 = STACK::operator_cast_to_int(&this->super_STACK);
  if (iVar1 != 0) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      iVar3 = STACK::operator[](&this->s2,(iVar1 + -1) - local_1c);
      std::ostream::operator<<((ostream *)&std::cout,iVar3);
      if (local_1c != iVar1 + -1) {
        std::operator<<((ostream *)&std::cout," ");
      }
    }
  }
  if ((iVar1 != 0) && (iVar2 != 0)) {
    std::operator<<((ostream *)&std::cout," ");
  }
  if (iVar2 != 0) {
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      iVar1 = STACK::operator[](&this->super_STACK,local_20);
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
      if (local_20 != iVar2 + -1) {
        std::operator<<((ostream *)&std::cout," ");
      }
    }
  }
  return;
}

Assistant:

void QUEUE::print() const {
  int output_len = int(s2);
  int input_len = this->STACK::operator int();
  if (output_len != 0) {
    for (int i = 0; i < output_len; i++) {
      std::cout << s2[output_len - 1 - i];
      if (i != output_len - 1)
        std::cout << " ";
    }
  }
  if (output_len != 0 && input_len != 0)
    std::cout << " ";
  if (input_len != 0) {
    for (int i = 0; i < input_len; i++) {
      std::cout << this->STACK::operator[](i);
      if (i != input_len - 1)
        std::cout << " ";
    }
  }
}